

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O1

void * raptor::Realloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0 && size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = realloc(ptr,size);
    if (pvVar1 == (void *)0x0) {
      abort();
    }
  }
  return pvVar1;
}

Assistant:

void* Realloc(void* ptr, size_t size) {
    if ((size == 0) && (ptr == nullptr)) {
        return nullptr;
    }
    ptr = ::realloc(ptr, size);
    if (!ptr) {
        abort();
    }
    return ptr;
}